

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_DBIStream.cpp
# Opt level: O1

ErrorCode PDB::HasValidDBIStream(RawFile *file)

{
  ErrorCode EVar1;
  ErrorCode EVar2;
  DirectMSFStream stream;
  StreamHeader header;
  DirectMSFStream local_70;
  uint32_t local_50;
  int local_4c;
  
  RawFile::CreateMSFStream<PDB::DirectMSFStream>(&local_70,file,3);
  EVar2 = InvalidStream;
  if (0x3f < local_70.m_size) {
    DirectMSFStream::ReadAtOffset(&local_70,&local_50,0x40,0);
    EVar1 = UnknownVersion;
    if (local_4c == 0x1310977) {
      EVar1 = Success;
    }
    EVar2 = InvalidSignature;
    if (local_50 == 0xffffffff) {
      EVar2 = EVar1;
    }
  }
  return EVar2;
}

Assistant:

PDB_NO_DISCARD PDB::ErrorCode PDB::HasValidDBIStream(const RawFile& file) PDB_NO_EXCEPT
{
	DirectMSFStream stream = file.CreateMSFStream<DirectMSFStream>(DBIStreamIndex);
	if (stream.GetSize() < sizeof(DBI::StreamHeader))
	{
		return ErrorCode::InvalidStream;
	}

	const DBI::StreamHeader header = stream.ReadAtOffset<DBI::StreamHeader>(0u);
	if (header.signature != DBI::StreamHeader::Signature)
	{
		return ErrorCode::InvalidSignature;
	}
	else if (header.version != DBI::StreamHeader::Version::V70)
	{
		return ErrorCode::UnknownVersion;
	}

	return ErrorCode::Success;
}